

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

GeneralMedium<pbrt::NanoVDBMediumProvider> *
pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>::Create
          (NanoVDBMediumProvider *provider,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  Allocator alloc_00;
  Allocator alloc_01;
  bool bVar1;
  ulong uVar2;
  RGBSpectrum *pRVar3;
  GeneralMedium<pbrt::NanoVDBMediumProvider> *pGVar4;
  ParameterDictionary *in_RSI;
  undefined8 in_R8;
  Float FVar5;
  Float FVar6;
  Float g;
  Float sigScale;
  string preset;
  SpectrumHandle sig_s;
  SpectrumHandle sig_a;
  RGBSpectrum *in_stack_fffffffffffffd68;
  ParameterDictionary *in_stack_fffffffffffffd70;
  RGBColorSpace *in_stack_fffffffffffffd78;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  SpectrumHandle *args_2;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  SpectrumHandle *in_stack_fffffffffffffda8;
  ParameterDictionary *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Allocator in_stack_fffffffffffffdb8;
  Transform *in_stack_fffffffffffffdc0;
  ParameterDictionary *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd8;
  SpectrumType spectrumType;
  Transform *in_stack_fffffffffffffde0;
  ParameterDictionary *in_stack_fffffffffffffde8;
  ParameterDictionary *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  undefined8 local_1d9;
  Float local_1b8;
  undefined1 local_1b1 [33];
  Float local_190;
  RGB local_18c;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_178;
  undefined8 local_170;
  allocator<char> local_159;
  string local_158 [40];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_130;
  RGB local_124;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_110;
  undefined8 local_108;
  undefined1 local_f1 [41];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_c8 [2];
  allocator<char> local_b1;
  string local_b0 [55];
  allocator<char> local_79;
  string local_78 [32];
  string local_58 [32];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_38;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_30 [3];
  ParameterDictionary *local_18;
  undefined8 local_8;
  
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_18 = in_RSI;
  local_8 = in_R8;
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  ParameterDictionary::GetOneString
            (in_stack_fffffffffffffdc8,(string *)in_stack_fffffffffffffdc0,
             (string *)in_stack_fffffffffffffdb8.memoryResource);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_c8[1].bits = local_8;
    in_stack_fffffffffffffdff =
         GetMediumScatteringProperties
                   (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                    (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                    in_stack_fffffffffffffdb8);
    if (!(bool)in_stack_fffffffffffffdff) {
      Warning<std::__cxx11::string&>
                ((FileLoc *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    }
  }
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  ::TaggedPointer(local_c8,(nullptr_t)0x0);
  bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ::operator==(local_30,local_c8);
  if (bVar1) {
    in_stack_fffffffffffffdf0 = (ParameterDictionary *)local_f1;
    in_stack_fffffffffffffde8 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    SpectrumHandle::TaggedPointer
              ((SpectrumHandle *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_108 = local_8;
    alloc_00.memoryResource._7_1_ = in_stack_fffffffffffffdff;
    alloc_00.memoryResource._0_7_ = in_stack_fffffffffffffdf8;
    ParameterDictionary::GetOneSpectrum
              (in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8,
               (SpectrumHandle *)in_stack_fffffffffffffde0,spectrumType,alloc_00);
    SpectrumHandle::operator=
              ((SpectrumHandle *)in_stack_fffffffffffffd70,
               (SpectrumHandle *)in_stack_fffffffffffffd68);
    std::__cxx11::string::~string((string *)(local_f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f1);
    TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    ::TaggedPointer(&local_110,(nullptr_t)0x0);
    bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            ::operator==(local_30,&local_110);
    if (bVar1) {
      in_stack_fffffffffffffde0 = RGBColorSpace::sRGB;
      RGB::RGB(&local_124,0.0011,0.0024,0.014);
      pRVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                         (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                          (RGB *)in_stack_fffffffffffffd70);
      spectrumType = (SpectrumType)((ulong)pRVar3 >> 0x20);
      SpectrumHandle::TaggedPointer<pbrt::RGBSpectrum>
                ((SpectrumHandle *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      SpectrumHandle::operator=
                ((SpectrumHandle *)in_stack_fffffffffffffd70,
                 (SpectrumHandle *)in_stack_fffffffffffffd68);
    }
  }
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  ::TaggedPointer(&local_130,(nullptr_t)0x0);
  bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ::operator==(&local_38,&local_130);
  if (bVar1) {
    in_stack_fffffffffffffdc8 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    SpectrumHandle::TaggedPointer
              ((SpectrumHandle *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_170 = local_8;
    alloc_01.memoryResource._7_1_ = in_stack_fffffffffffffdff;
    alloc_01.memoryResource._0_7_ = in_stack_fffffffffffffdf8;
    ParameterDictionary::GetOneSpectrum
              (in_stack_fffffffffffffdf0,(string *)in_stack_fffffffffffffde8,
               (SpectrumHandle *)in_stack_fffffffffffffde0,spectrumType,alloc_01);
    SpectrumHandle::operator=
              ((SpectrumHandle *)in_stack_fffffffffffffd70,
               (SpectrumHandle *)in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
    TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    ::TaggedPointer(&local_178,(nullptr_t)0x0);
    bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            ::operator==(&local_38,&local_178);
    if (bVar1) {
      in_stack_fffffffffffffdc0 = RGBColorSpace::sRGB;
      RGB::RGB(&local_18c,2.55,3.21,3.77);
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::RGBSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB>
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                 (RGB *)in_stack_fffffffffffffd70);
      SpectrumHandle::TaggedPointer<pbrt::RGBSpectrum>
                ((SpectrumHandle *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      SpectrumHandle::operator=
                ((SpectrumHandle *)in_stack_fffffffffffffd70,
                 (SpectrumHandle *)in_stack_fffffffffffffd68);
    }
  }
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b1;
  args = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)args,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  FVar5 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68,0.0);
  std::__cxx11::string::~string((string *)(local_1b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  args_2 = (SpectrumHandle *)&local_1d9;
  local_190 = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)args,(allocator<char> *)CONCAT44(FVar5,in_stack_fffffffffffffda0));
  FVar6 = ParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68,0.0);
  std::__cxx11::string::~string((string *)((long)&local_1d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  local_1b8 = FVar6;
  pGVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>,pbrt::NanoVDBMediumProvider_const*&,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,float&,float&,pbrt::Transform_const&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)this,(NanoVDBMediumProvider **)args,
                      (SpectrumHandle *)CONCAT44(FVar5,in_stack_fffffffffffffda0),args_2,
                      (float *)local_18,(float *)CONCAT44(FVar6,in_stack_fffffffffffffd88),
                      in_stack_fffffffffffffdc0,
                      (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string(local_58);
  return pGVar4;
}

Assistant:

static GeneralMedium<DensityProvider> *Create(const DensityProvider *provider,
                                                  const ParameterDictionary &parameters,
                                                  const Transform &renderFromMedium,
                                                  const FileLoc *loc, Allocator alloc) {
        SpectrumHandle sig_a = nullptr, sig_s = nullptr;
        std::string preset = parameters.GetOneString("preset", "");
        if (!preset.empty()) {
            if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
                Warning(loc, "Material preset \"%s\" not found.", preset);
        }

        if (sig_a == nullptr) {
            sig_a = parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_a == nullptr)
                sig_a = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(.0011f, .0024f, .014f));
        }
        if (sig_s == nullptr) {
            sig_s = parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_s == nullptr)
                sig_s = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(2.55f, 3.21f, 3.77f));
        }

        Float sigScale = parameters.GetOneFloat("scale", 1.f);

        Float g = parameters.GetOneFloat("g", 0.0f);

        return alloc.new_object<GeneralMedium<DensityProvider>>(
            provider, sig_a, sig_s, sigScale, g, renderFromMedium, alloc);
    }